

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rumors.c
# Opt level: O1

void restore_oracles(memfile *mf)

{
  int32_t iVar1;
  ulong uVar2;
  
  oracle_cnt = mread32(mf);
  if (oracle_cnt != 0) {
    oracle_loc = (int *)malloc((ulong)oracle_cnt << 2);
    if (oracle_cnt != 0) {
      uVar2 = 0;
      do {
        iVar1 = mread32(mf);
        oracle_loc[uVar2] = iVar1;
        uVar2 = uVar2 + 1;
      } while (uVar2 < oracle_cnt);
    }
    oracle_flg = 1;
  }
  return;
}

Assistant:

void restore_oracles(struct memfile *mf)
{
	int i;
	oracle_cnt = mread32(mf);
	if (oracle_cnt) {
	    oracle_loc = malloc(oracle_cnt * sizeof(int));
	    for (i = 0; i < oracle_cnt; i++)
		oracle_loc[i] = mread32(mf);
	    oracle_flg = 1;	/* no need to call init_oracles() */
	}
}